

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall cfd::ConfidentialTransactionContext::Verify(ConfidentialTransactionContext *this)

{
  pointer pCVar1;
  bool bVar2;
  ConfidentialTransactionContext *this_00;
  pointer this_01;
  OutPoint outpoint;
  
  pCVar1 = (this->super_ConfidentialTransaction).vin_.
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->super_ConfidentialTransaction).vin_.
                 super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != pCVar1; this_01 = this_01 + 1
      ) {
    this_00 = (ConfidentialTransactionContext *)&stack0xffffffffffffffb0;
    core::AbstractTxIn::GetOutPoint
              ((OutPoint *)&stack0xffffffffffffffb0,&this_01->super_AbstractTxIn);
    bVar2 = IsFindOutPoint(this_00,&this->verify_ignore_map_,(OutPoint *)&stack0xffffffffffffffb0);
    if (!bVar2) {
      Verify(this,(OutPoint *)&stack0xffffffffffffffb0);
    }
    core::Txid::~Txid((Txid *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

void ConfidentialTransactionContext::Verify() {
  for (const auto& vin : vin_) {
    OutPoint outpoint = vin.GetOutPoint();
    if (!IsFindOutPoint(verify_ignore_map_, outpoint)) {
      Verify(outpoint);
    }
  }
}